

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app2.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  char *__end;
  string s2;
  string s1;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Hello","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Hello","");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((local_38 == local_58) && (local_38 != 0)) {
    bcmp(local_40,local_60,local_38);
  }
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return 0;
}

Assistant:

int main(int, char* [])
{
//    const char* s1 = "Hello";
//    const char* s2 = "Hello";

    auto i = 10; // integer
    auto d = 10.5; // double
    auto f = 20.3f; // float
    auto li = 10l;
    auto s1 = "Hello"_s; //  std::string("Hello");
    auto s2 = "Hello"_s;
    std::cout << (size_t)&s1[0] << std::endl;
    std::cout << (size_t)&s2[0] << std::endl;
    std::cout << (s1 == s2) << std::endl;

    return 0;
}